

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::GLSLConstantIntegralExpressionTest::getProgramInterface
          (GLSLConstantIntegralExpressionTest *this,GLuint param_1,
          ProgramInterface *program_interface,VaryingPassthrough *param_3)

{
  int iVar1;
  deUint32 dVar2;
  GLuint GVar3;
  uint uVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  uint *puVar6;
  char local_a8 [8];
  GLchar buffer [16];
  size_t local_90;
  size_t position;
  allocator<char> local_71;
  undefined1 local_70 [8];
  string globals;
  int local_44;
  GLuint goten_div;
  uint local_3c;
  uint local_38;
  GLuint gohan_div;
  GLint max_transform_feedback_interleaved_components;
  GLint max_transform_feedback_buffers;
  Functions *gl;
  VaryingPassthrough *param_3_local;
  ProgramInterface *program_interface_local;
  GLSLConstantIntegralExpressionTest *pGStack_10;
  GLuint param_1_local;
  GLSLConstantIntegralExpressionTest *this_local;
  
  gl = (Functions *)param_3;
  param_3_local = (VaryingPassthrough *)program_interface;
  program_interface_local._4_4_ = param_1;
  pGStack_10 = this;
  pRVar5 = deqp::Context::getRenderContext
                     ((this->super_TextureTestBase).super_TestBase.super_TestCase.m_context);
  iVar1 = (*pRVar5->_vptr_RenderContext[3])();
  _max_transform_feedback_interleaved_components = CONCAT44(extraout_var,iVar1);
  gohan_div = 0;
  local_38 = 0;
  (**(code **)(_max_transform_feedback_interleaved_components + 0x868))(0x8e70,&gohan_div);
  dVar2 = (**(code **)(_max_transform_feedback_interleaved_components + 0x800))();
  glu::checkError(dVar2,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x2085);
  (**(code **)(_max_transform_feedback_interleaved_components + 0x868))(0x8c8a,&local_38);
  dVar2 = (**(code **)(_max_transform_feedback_interleaved_components + 0x800))();
  glu::checkError(dVar2,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x2087);
  goten_div = 1;
  GVar3 = gohan_div;
  if ((int)gohan_div < 0) {
    GVar3 = gohan_div + 0xf;
  }
  local_44 = (int)GVar3 >> 4;
  puVar6 = (uint *)std::max<int>((int *)&goten_div,&local_44);
  local_3c = *puVar6;
  globals.field_2._12_4_ = 1;
  uVar4 = local_38;
  if ((int)local_38 < 0) {
    uVar4 = local_38 + 0xf;
  }
  globals.field_2._8_4_ = (int)uVar4 >> 4;
  puVar6 = (uint *)std::max<int>((int *)(globals.field_2._M_local_buf + 0xc),
                                 (int *)(globals.field_2._M_local_buf + 8));
  uVar4 = *puVar6;
  this->m_gohan_length = gohan_div / local_3c;
  this->m_goten_length = local_38 / uVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70,
             "uniform uint goku [GL_ARB_enhanced_layouts / 1];\nuniform uint gohan[gl_MaxTransformFeedbackBuffers / GOHAN_DIV];\nuniform uint goten[gl_MaxTransformFeedbackInterleavedComponents / GOTEN_DIV];\n"
             ,&local_71);
  std::allocator<char>::~allocator(&local_71);
  local_90 = 0;
  sprintf(local_a8,"%d",(ulong)local_3c);
  Utils::replaceToken("GOHAN_DIV",&local_90,local_a8,(string *)local_70);
  sprintf(local_a8,"%d",(ulong)uVar4);
  Utils::replaceToken("GOTEN_DIV",&local_90,local_a8,(string *)local_70);
  std::__cxx11::string::operator=
            ((string *)
             &param_3_local[1].m_tess_ctrl.
              super__Vector_base<gl4cts::EnhancedLayouts::Utils::VaryingConnection,_std::allocator<gl4cts::EnhancedLayouts::Utils::VaryingConnection>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_70);
  std::__cxx11::string::operator=
            ((string *)
             &param_3_local[2].m_tess_eval.
              super__Vector_base<gl4cts::EnhancedLayouts::Utils::VaryingConnection,_std::allocator<gl4cts::EnhancedLayouts::Utils::VaryingConnection>_>
              ._M_impl.super__Vector_impl_data._M_finish,(string *)local_70);
  std::__cxx11::string::operator=((string *)&param_3_local[3].m_vertex,(string *)local_70);
  std::__cxx11::string::operator=
            ((string *)
             &param_3_local[4].m_vertex.
              super__Vector_base<gl4cts::EnhancedLayouts::Utils::VaryingConnection,_std::allocator<gl4cts::EnhancedLayouts::Utils::VaryingConnection>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)local_70);
  std::__cxx11::string::operator=
            ((string *)
             &param_3_local[6].m_fragment.
              super__Vector_base<gl4cts::EnhancedLayouts::Utils::VaryingConnection,_std::allocator<gl4cts::EnhancedLayouts::Utils::VaryingConnection>_>
              ._M_impl.super__Vector_impl_data._M_finish,(string *)local_70);
  std::__cxx11::string::operator=((string *)&param_3_local->m_tess_ctrl,(string *)local_70);
  std::__cxx11::string::~string((string *)local_70);
  return;
}

Assistant:

void GLSLConstantIntegralExpressionTest::getProgramInterface(GLuint /* test_case_index */,
															 Utils::ProgramInterface& program_interface,
															 Utils::VaryingPassthrough& /* varying_passthrough */)
{
	/* Get constants */
	const Functions& gl = m_context.getRenderContext().getFunctions();

	GLint max_transform_feedback_buffers				= 0;
	GLint max_transform_feedback_interleaved_components = 0;

	gl.getIntegerv(GL_MAX_TRANSFORM_FEEDBACK_BUFFERS, &max_transform_feedback_buffers);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");
	gl.getIntegerv(GL_MAX_TRANSFORM_FEEDBACK_INTERLEAVED_COMPONENTS, &max_transform_feedback_interleaved_components);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	GLuint gohan_div = std::max(1, max_transform_feedback_buffers / 16);
	GLuint goten_div = std::max(1, max_transform_feedback_interleaved_components / 16);

	m_gohan_length = max_transform_feedback_buffers / gohan_div;
	m_goten_length = max_transform_feedback_interleaved_components / goten_div;

	/* Globals */
	std::string globals = "uniform uint goku [GL_ARB_enhanced_layouts / 1];\n"
						  "uniform uint gohan[gl_MaxTransformFeedbackBuffers / GOHAN_DIV];\n"
						  "uniform uint goten[gl_MaxTransformFeedbackInterleavedComponents / GOTEN_DIV];\n";

	size_t position = 0;
	GLchar buffer[16];

	sprintf(buffer, "%d", gohan_div);
	Utils::replaceToken("GOHAN_DIV", position, buffer, globals);

	sprintf(buffer, "%d", goten_div);
	Utils::replaceToken("GOTEN_DIV", position, buffer, globals);

	program_interface.m_vertex.m_globals	= globals;
	program_interface.m_tess_ctrl.m_globals = globals;
	program_interface.m_tess_eval.m_globals = globals;
	program_interface.m_geometry.m_globals  = globals;
	program_interface.m_fragment.m_globals  = globals;
	program_interface.m_compute.m_globals   = globals;
}